

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::ScreenGeometryEvent,QScreen*,QRect,QRect>
               (QScreen *args,QRect args_1,QRect args_2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  ScreenGeometryEvent event;
  undefined1 local_98 [16];
  undefined1 *local_88;
  Data *pDStack_80;
  QObject *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QRect local_50;
  QRect local_40;
  long local_30;
  
  local_50._8_8_ = args_2._8_8_;
  local_50._0_8_ = args_2._0_8_;
  local_40._8_8_ = args_1._8_8_;
  local_40._0_8_ = args_1._0_8_;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::ScreenGeometryEvent,QScreen*,QRect,QRect>
              (args,args_1,args_2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_002ff1b0;
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  pDStack_80 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWindowSystemInterfacePrivate::ScreenGeometryEvent::ScreenGeometryEvent
            ((ScreenGeometryEvent *)local_98,args,&local_40,&local_50);
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent((WindowSystemEvent *)local_98);
LAB_002ff184:
    uVar4 = local_88._0_1_;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_98);
    if ((char)iVar3 != '\0') goto LAB_002ff184;
    uVar4 = 0;
  }
  QWindowSystemInterfacePrivate::ScreenGeometryEvent::~ScreenGeometryEvent
            ((ScreenGeometryEvent *)local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)uVar4;
  }
LAB_002ff1b0:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}